

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hh
# Opt level: O2

char qpdf::util::hex_decode_char(char digit)

{
  char cVar1;
  byte bVar2;
  
  bVar2 = digit - 0x30;
  if (9 < bVar2) {
    if (digit < 'a') {
      cVar1 = '\x10';
      if ('@' < digit) {
        cVar1 = digit + -0x37;
      }
      return cVar1;
    }
    bVar2 = digit + 0xa9;
  }
  return bVar2;
}

Assistant:

inline constexpr char
    hex_decode_char(char digit)
    {
        return digit <= '9' && digit >= '0'
            ? char(digit - '0')
            : (digit >= 'a' ? char(digit - 'a' + 10)
                            : (digit >= 'A' ? char(digit - 'A' + 10) : '\20'));
    }